

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_ssl_client.cpp
# Opt level: O2

string * __thiscall
bidfx_public_api::tools::OpenSSLClient::OpenSSLErrAsString_abi_cxx11_
          (string *__return_storage_ptr__,OpenSSLClient *this)

{
  BIO_METHOD *type;
  BIO *bp;
  long lVar1;
  char *buf;
  
  type = BIO_s_mem();
  bp = BIO_new(type);
  ERR_print_errors(bp);
  buf = (char *)0x0;
  lVar1 = BIO_ctrl(bp,3,0,&buf);
  BIO_free(bp);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,buf,buf + lVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenSSLClient::OpenSSLErrAsString ()
{
    BIO *bio = BIO_new (BIO_s_mem ());
    ERR_print_errors (bio);
    char *buf = nullptr;
    size_t len = BIO_get_mem_data (bio, &buf);
    BIO_free (bio);
    return std::string(buf, len);
}